

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea_p.hpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::AbstractScrollAreaPrivate
          (AbstractScrollAreaPrivate *this,AbstractScrollArea *parent)

{
  AbstractScrollArea *parent_local;
  AbstractScrollAreaPrivate *this_local;
  
  this->_vptr_AbstractScrollAreaPrivate = (_func_int **)&PTR__AbstractScrollAreaPrivate_00243fd0;
  this->q = parent;
  QColor::QColor(&this->indicatorColor);
  this->viewport = (QWidget *)0x0;
  QSize::QSize(&this->scrolledAreaSize,0,0);
  QPoint::QPoint(&this->topLeftCorner,0,0);
  this->top = 0;
  this->bottom = 0;
  this->right = 0;
  this->left = 0;
  this->leftMouseButtonPressed = false;
  QPoint::QPoint(&this->mousePos);
  this->horIndicator = (ScrollIndicator *)0x0;
  this->vertIndicator = (ScrollIndicator *)0x0;
  this->animationTimer = (QTimer *)0x0;
  this->startBlurAnimTimer = (QTimer *)0x0;
  this->animationTimeout = 100;
  this->animationAlphaDelta = 0x19;
  this->scroller = (Scroller *)0x0;
  this->horBlur = (BlurEffect *)0x0;
  this->vertBlur = (BlurEffect *)0x0;
  this->horBlurAnim = (QVariantAnimation *)0x0;
  this->vertBlurAnim = (QVariantAnimation *)0x0;
  return;
}

Assistant:

explicit AbstractScrollAreaPrivate( AbstractScrollArea * parent )
		:	q( parent )
		,	viewport( 0 )
		,	scrolledAreaSize( 0, 0 )
		,	topLeftCorner( 0, 0 )
		,	top( 0 )
		,	bottom( 0 )
		,	right( 0 )
		,	left( 0 )
		,	leftMouseButtonPressed( false )
		,	horIndicator( 0 )
		,	vertIndicator( 0 )
		,	animationTimer( 0 )
		,	startBlurAnimTimer( 0 )
		,	animationTimeout( 100 )
		,	animationAlphaDelta( 25 )
		,	scroller( 0 )
		,	horBlur( 0 )
		,	vertBlur( 0 )
		,	horBlurAnim( 0 )
		,	vertBlurAnim( 0 )
	{
	}